

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O0

int ecx_FOEread(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int *psize,void *p
               ,int timeout)

{
  int iVar1;
  uint8 uVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  bool local_86a;
  short local_868;
  uint8 local_866 [4];
  boolean worktodo;
  uint8 cnt;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  ushort local_5e;
  int iStack_5c;
  uint16 segmentdata;
  uint16 maxdata;
  uint16 fnsize;
  int32 prevpacket;
  int32 packetnumber;
  int32 buffersize;
  int32 dataread;
  int wkc;
  ec_FOEt *aFOEp;
  ec_FOEt *FOEp;
  void *p_local;
  int *psize_local;
  uint32 password_local;
  char *filename_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  packetnumber = 0;
  iStack_5c = 0;
  iVar1 = *psize;
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)&local_868);
  sVar5 = strlen(filename);
  uVar3 = context->slavelist[slave].mbx_l - 0xc;
  local_5e = (ushort)sVar5;
  if (uVar3 < (ushort)sVar5) {
    local_5e = uVar3;
  }
  local_868 = local_5e + 6;
  local_866[0] = '\0';
  local_866[1] = '\0';
  local_866[2] = '\0';
  uVar2 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
  context->slavelist[slave].mbx_cnt = uVar2;
  local_866[3] = uVar2 * '\x10' + '\x04';
  worktodo = '\x01';
  MbxOut._0_4_ = password;
  memcpy(MbxOut + 4,filename,(ulong)local_5e);
  buffersize = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_868,20000);
  FOEp = (ec_FOEt *)p;
  if (0 < buffersize) {
    do {
      local_86a = false;
      ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
      buffersize = ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),timeout);
      if (0 < buffersize) {
        if ((MbxOut[0x3fd] & 0xf) == 4) {
          if (MbxOut[0x3fe] == '\x03') {
            uVar4 = MbxOut._1016_2_ - 6;
            iStack_5c = iStack_5c + 1;
            if ((MbxIn._0_4_ == iStack_5c) && ((int)(packetnumber + (uint)uVar4) <= iVar1)) {
              memcpy(FOEp,MbxIn + 4,(ulong)uVar4);
              packetnumber = (uint)uVar4 + packetnumber;
              FOEp = (ec_FOEt *)((long)&(FOEp->MbxHeader).length + (long)(int)(uint)uVar4);
              local_868 = 6;
              local_866[0] = '\0';
              local_866[1] = '\0';
              local_866[2] = '\0';
              uVar2 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
              context->slavelist[slave].mbx_cnt = uVar2;
              local_866[3] = uVar2 * '\x10' + '\x04';
              worktodo = '\x04';
              MbxOut._0_4_ = MbxIn._0_4_;
              buffersize = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_868,20000);
              local_86a = 0 < buffersize && uVar4 == uVar3;
              if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
                (*context->FOEhook)(slave,MbxIn._0_4_,packetnumber);
              }
            }
            else {
              buffersize = -6;
            }
          }
          else if (MbxOut[0x3fe] == '\x05') {
            buffersize = -5;
          }
          else {
            buffersize = -3;
          }
        }
        else {
          buffersize = -3;
        }
        *psize = packetnumber;
      }
    } while (local_86a);
  }
  return buffersize;
}

Assistant:

int ecx_FOEread(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int *psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 dataread = 0;
   int32 buffersize, packetnumber, prevpacket = 0;
   uint16 fnsize, maxdata, segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo;

   buffersize = *psize;
   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_READ;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               if(aFOEp->OpCode == ECT_FOE_DATA)
               {
                  segmentdata = etohs(aFOEp->MbxHeader.length) - 0x0006;
                  packetnumber = etohl(aFOEp->PacketNumber);
                  if ((packetnumber == ++prevpacket) && (dataread + segmentdata <= buffersize))
                  {
                     memcpy(p, &aFOEp->Data[0], segmentdata);
                     dataread += segmentdata;
                     p = (uint8 *)p + segmentdata;
                     if (segmentdata == maxdata)
                     {
                        worktodo = TRUE; 
                     }
                     FOEp->MbxHeader.length = htoes(0x0006);
                     FOEp->MbxHeader.address = htoes(0x0000);
                     FOEp->MbxHeader.priority = 0x00;
                     /* get new mailbox count value */
                     cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                     context->slavelist[slave].mbx_cnt = cnt;
                     FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                     FOEp->OpCode = ECT_FOE_ACK;
                     FOEp->PacketNumber = htoel(packetnumber);
                     /* send FoE ack to slave */
                     wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                     if (wkc <= 0)
                     {   
                        worktodo = FALSE;
                     }
                     if (context->FOEhook)
                     {
                        context->FOEhook(slave, packetnumber, dataread);
                     }
                  }
                  else
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_BUF2SMALL;
                  }
               }
               else
               {
                  if(aFOEp->OpCode == ECT_FOE_ERROR)
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                  }
                  else
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
            *psize = dataread;
         }
      } while (worktodo);   
   }
   
   return wkc;
}